

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BlitDefaultFramebufferCase::render
          (BlitDefaultFramebufferCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  DataType type;
  deUint32 dVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  int dstY1;
  TextureFormat texFormat;
  TransferFormat TVar5;
  DataTypes *samplerTypes;
  Context *pCVar6;
  deUint32 tex;
  deUint32 local_36c;
  _Vector_base<glu::DataType,_std::allocator<glu::DataType>_> local_368;
  deUint32 fbo;
  Surface *local_340;
  TransferFormat local_338;
  Vector<float,_4> local_330;
  GradientShader gradShader;
  Texture2DShader texShader;
  
  local_340 = dst;
  texFormat = glu::mapGLInternalFormat(this->m_format);
  TVar5 = glu::getTransferFormat(texFormat);
  FboTestUtil::GradientShader::GradientShader(&gradShader,TYPE_FLOAT_VEC4);
  local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  type = glu::getSampler2DType(texFormat);
  samplerTypes = FboTestUtil::DataTypes::operator<<((DataTypes *)&local_368,type);
  tcu::Vector<float,_4>::Vector(&local_330,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fbo,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texShader,samplerTypes,TYPE_FLOAT_VEC4,&local_330,(Vector<float,_4> *)&fbo);
  local_338 = TVar5;
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base(&local_368);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_36c = (*pCVar6->_vptr_Context[0x75])(pCVar6,&gradShader);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar1 = (*pCVar6->_vptr_Context[0x75])(pCVar6,&texShader);
  fbo = 0;
  tex = 0;
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_368,0.0);
  tcu::Vector<float,_4>::Vector(&local_330,1.0);
  FboTestUtil::GradientShader::setGradient
            (&gradShader,pCVar6,local_36c,(Vec4 *)&local_368,&local_330);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texShader,pCVar6,dVar1);
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,this->m_filter);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,this->m_filter);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,this->m_format,0x80,0x80,0,local_338.format,local_338.dataType,
             (void *)0x0);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,tex,0);
  FboTestCase::checkError(&this->super_FboTestCase);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  dVar2 = (*((this->super_FboTestCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [6])();
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,dVar2);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
  local_368._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_368._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  local_330.m_data[0] = 1.0;
  local_330.m_data[1] = 1.0;
  local_330.m_data[2] = 0.0;
  sglr::drawQuad(pCVar6,local_36c,(Vec3 *)&local_368,(Vec3 *)&local_330);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,fbo);
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  iVar4 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glBlitFramebuffer
            (this_00,0,0,iVar3,iVar4,0,0,0x80,0x80,0x4000,this->m_filter);
  dVar2 = (*((this->super_FboTestCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [6])();
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,dVar2);
  local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000;
  local_368._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  sglr::ContextWrapper::glClearBufferfv(this_00,0x1800,0,(float *)&local_368);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
  local_368._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_368._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  local_330.m_data[0] = 0.0;
  local_330.m_data[1] = 1.0;
  local_330.m_data[2] = 0.0;
  sglr::drawQuad(pCVar6,dVar1,(Vec3 *)&local_368,(Vec3 *)&local_330);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,fbo);
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  iVar4 = sglr::ContextWrapper::getWidth(this_00);
  dstY1 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glBlitFramebuffer
            (this_00,0,0,0x80,0x80,iVar3 / 2,0,iVar4,dstY1,0x4000,this->m_filter);
  dVar1 = (*((this->super_FboTestCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [6])();
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,dVar1);
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  iVar4 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels(&this->super_FboTestCase,local_340,0,0,iVar3,iVar4);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texShader);
  sglr::ShaderProgram::~ShaderProgram(&gradShader.super_ShaderProgram);
  return;
}

Assistant:

virtual void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFormat		= glu::mapGLInternalFormat(m_format);
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(colorFormat);
		GradientShader			gradShader		(glu::TYPE_FLOAT_VEC4);
		Texture2DShader			texShader		(DataTypes() << glu::getSampler2DType(colorFormat), glu::TYPE_FLOAT_VEC4);
		deUint32				gradShaderID	= getCurrentContext()->createProgram(&gradShader);
		deUint32				texShaderID		= getCurrentContext()->createProgram(&texShader);
		deUint32				fbo				= 0;
		deUint32				tex				= 0;
		const int				texW			= 128;
		const int				texH			= 128;

		// Setup shaders
		gradShader.setGradient(*getCurrentContext(), gradShaderID, Vec4(0.0f), Vec4(1.0f));
		texShader.setUniforms(*getCurrentContext(), texShaderID);

		// FBO
		glGenFramebuffers(1, &fbo);
		glGenTextures(1, &tex);

		glBindTexture(GL_TEXTURE_2D, tex);
		glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	m_filter);
		glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	m_filter);
		glTexImage2D(GL_TEXTURE_2D, 0, m_format, texW, texH, 0, transferFmt.format, transferFmt.dataType, DE_NULL);

		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);
		checkError();
		checkFramebufferStatus(GL_FRAMEBUFFER);

		// Render gradient to screen.
		glBindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());

		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Blit gradient from screen to fbo.
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo);
		glBlitFramebuffer(0, 0, getWidth(), getHeight(), 0, 0, texW, texH, GL_COLOR_BUFFER_BIT, m_filter);

		// Fill left half of viewport with quad that uses texture.
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
		glClearBufferfv(GL_COLOR, 0, Vec4(1.0f, 0.0f, 0.0f, 1.0f).getPtr());
		sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(0.0f, 1.0f, 0.0f));

		// Blit fbo to right half.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, fbo);
		glBlitFramebuffer(0, 0, texW, texH, getWidth()/2, 0, getWidth(), getHeight(), GL_COLOR_BUFFER_BIT, m_filter);

		glBindFramebuffer(GL_READ_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
		readPixels(dst, 0, 0, getWidth(), getHeight());
	}